

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_quads_to_grids
          (SceneGraph *this,Ref<embree::SceneGraph::QuadMeshNode> *qmesh,uint resX,uint resY)

{
  ulong uVar1;
  pointer *ppGVar2;
  Vec3fa *pVVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  float *pfVar6;
  pointer pQVar7;
  Vec3fa *pVVar8;
  pointer pvVar9;
  long lVar10;
  void *ptr;
  iterator __position;
  undefined8 uVar11;
  GridMeshNode *this_00;
  void *pvVar12;
  ulong uVar13;
  size_t numTimeSteps;
  QuadMeshNode *pQVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  uint local_134;
  Grid local_11c;
  ulong local_110;
  Ref<embree::SceneGraph::QuadMeshNode> *local_108;
  long local_100;
  GridMeshNode *local_f8;
  Ref<embree::SceneGraph::MaterialNode> local_f0;
  uint local_e4;
  float local_e0;
  float local_dc;
  Node *local_d8;
  pointer local_d0;
  pointer local_c8;
  QuadMeshNode *local_c0;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pQVar14 = qmesh->ptr;
  local_c8 = (pQVar14->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (pQVar14->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_108 = qmesh;
  local_d8 = (Node *)this;
  this_00 = (GridMeshNode *)operator_new(0xa8);
  local_f0.ptr = (pQVar14->material).ptr;
  if (local_f0.ptr != (MaterialNode *)0x0) {
    (*((local_f0.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
    pQVar14 = local_108->ptr;
  }
  numTimeSteps = (long)local_d0 - (long)local_c8 >> 5;
  GridMeshNode::GridMeshNode(this_00,&local_f0,pQVar14->time_range,numTimeSteps);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_f0.ptr != (MaterialNode *)0x0) {
    (*((local_f0.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_c0 = local_108->ptr;
  if ((local_c0->quads).
      super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_c0->quads).
      super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_dc = (float)(resX - 1);
    local_e0 = (float)(resY - 1);
    local_b8 = &this_00->grids;
    local_a8 = numTimeSteps + (numTimeSteps == 0);
    local_110 = 0;
    local_f8 = this_00;
    do {
      local_e4 = (uint)((this_00->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->size_active;
      if (local_d0 != local_c8) {
        local_b0 = local_110 << 4;
        local_100 = 0;
        do {
          if (resY != 0) {
            pQVar7 = (local_c0->quads).
                     super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar15 = local_100 * 0x20;
            pVVar8 = (local_108->ptr->positions).
                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_100].items;
            pVVar3 = pVVar8 + *(uint *)((long)&pQVar7->v0 + local_b0);
            fVar22 = (pVVar3->field_0).m128[0];
            fVar23 = (pVVar3->field_0).m128[1];
            fVar24 = (pVVar3->field_0).m128[2];
            fVar25 = (pVVar3->field_0).m128[3];
            pVVar3 = pVVar8 + *(uint *)((long)&pQVar7->v1 + local_b0);
            fVar26 = (pVVar3->field_0).m128[0];
            fVar27 = (pVVar3->field_0).m128[1];
            fVar28 = (pVVar3->field_0).m128[2];
            fVar29 = (pVVar3->field_0).m128[3];
            pVVar3 = pVVar8 + *(uint *)((long)&pQVar7->v3 + local_b0);
            fVar30 = (pVVar3->field_0).m128[0];
            fVar31 = (pVVar3->field_0).m128[1];
            fVar32 = (pVVar3->field_0).m128[2];
            fVar33 = (pVVar3->field_0).m128[3];
            pVVar8 = pVVar8 + *(uint *)((long)&pQVar7->v2 + local_b0);
            fVar34 = (pVVar8->field_0).m128[0];
            fVar35 = (pVVar8->field_0).m128[1];
            fVar36 = (pVVar8->field_0).m128[2];
            fVar37 = (pVVar8->field_0).m128[3];
            local_134 = 0;
            local_a0 = lVar15;
            local_98 = fVar34;
            fStack_94 = fVar35;
            fStack_90 = fVar36;
            fStack_8c = fVar37;
            local_88 = fVar30;
            fStack_84 = fVar31;
            fStack_80 = fVar32;
            fStack_7c = fVar33;
            local_78 = fVar26;
            fStack_74 = fVar27;
            fStack_70 = fVar28;
            fStack_6c = fVar29;
            local_68 = fVar22;
            fStack_64 = fVar23;
            fStack_60 = fVar24;
            fStack_5c = fVar25;
            do {
              if (resX != 0) {
                fVar38 = (float)local_134 / local_e0;
                fVar42 = 1.0 - fVar38;
                uVar19 = 0;
                lVar16 = lVar15;
                fVar39 = fVar38;
                fVar40 = fVar38;
                fVar41 = fVar38;
                fVar43 = fVar42;
                fVar44 = fVar42;
                fVar45 = fVar42;
                local_58 = fVar42;
                fStack_54 = fVar42;
                fStack_50 = fVar42;
                fStack_4c = fVar42;
                local_48 = fVar38;
                fStack_44 = fVar38;
                fStack_40 = fVar38;
                fStack_3c = fVar38;
                do {
                  pvVar9 = (this_00->positions).
                           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar10 = *(long *)((long)&pvVar9->size_active + lVar16);
                  uVar13 = *(ulong *)((long)&pvVar9->size_alloced + lVar16);
                  uVar1 = lVar10 + 1;
                  lVar15 = lVar16;
                  if (uVar13 < uVar1) {
                    uVar18 = uVar1;
                    uVar17 = uVar13;
                    if (uVar13 != 0) {
                      do {
                        uVar18 = uVar17 * 2 + (ulong)(uVar17 * 2 == 0);
                        uVar17 = uVar18;
                      } while (uVar18 < uVar1);
                    }
                    if (uVar13 != uVar18) {
                      ptr = *(void **)((long)&pvVar9->items + lVar16);
                      pvVar12 = alignedMalloc(uVar18 << 4,0x10);
                      *(void **)((long)&pvVar9->items + lVar16) = pvVar12;
                      if (*(long *)((long)&pvVar9->size_active + lVar16) != 0) {
                        lVar15 = 0;
                        uVar13 = 0;
                        do {
                          puVar4 = (undefined8 *)((long)ptr + lVar15);
                          uVar11 = puVar4[1];
                          puVar5 = (undefined8 *)(*(long *)((long)&pvVar9->items + lVar16) + lVar15)
                          ;
                          *puVar5 = *puVar4;
                          puVar5[1] = uVar11;
                          uVar13 = uVar13 + 1;
                          lVar15 = lVar15 + 0x10;
                        } while (uVar13 < *(ulong *)((long)&pvVar9->size_active + lVar16));
                      }
                      alignedFree(ptr);
                      *(long *)((long)&pvVar9->size_active + lVar16) = lVar10;
                      *(ulong *)((long)&pvVar9->size_alloced + lVar16) = uVar18;
                      lVar15 = local_a0;
                      fVar22 = local_68;
                      fVar23 = fStack_64;
                      fVar24 = fStack_60;
                      fVar25 = fStack_5c;
                      fVar26 = local_78;
                      fVar27 = fStack_74;
                      fVar28 = fStack_70;
                      fVar29 = fStack_6c;
                      fVar30 = local_88;
                      fVar31 = fStack_84;
                      fVar32 = fStack_80;
                      fVar33 = fStack_7c;
                      fVar34 = local_98;
                      fVar35 = fStack_94;
                      fVar36 = fStack_90;
                      fVar37 = fStack_8c;
                      fVar38 = local_48;
                      fVar39 = fStack_44;
                      fVar40 = fStack_40;
                      fVar41 = fStack_3c;
                      fVar42 = local_58;
                      fVar43 = fStack_54;
                      fVar44 = fStack_50;
                      fVar45 = fStack_4c;
                    }
                  }
                  fVar20 = (float)uVar19 / local_dc;
                  fVar21 = 1.0 - fVar20;
                  *(ulong *)((long)&pvVar9->size_active + lVar16) = uVar1;
                  pfVar6 = (float *)(*(long *)((long)&pvVar9->items + lVar16) + lVar10 * 0x10);
                  *pfVar6 = fVar20 * fVar34 * fVar38 +
                            fVar21 * fVar30 * fVar38 +
                            fVar26 * fVar20 * fVar42 + fVar22 * fVar21 * fVar42;
                  pfVar6[1] = fVar20 * fVar35 * fVar39 +
                              fVar21 * fVar31 * fVar39 +
                              fVar27 * fVar20 * fVar43 + fVar23 * fVar21 * fVar43;
                  pfVar6[2] = fVar20 * fVar36 * fVar40 +
                              fVar21 * fVar32 * fVar40 +
                              fVar28 * fVar20 * fVar44 + fVar24 * fVar21 * fVar44;
                  pfVar6[3] = fVar20 * fVar37 * fVar41 +
                              fVar21 * fVar33 * fVar41 +
                              fVar29 * fVar20 * fVar45 + fVar25 * fVar21 * fVar45;
                  uVar19 = uVar19 + 1;
                  lVar16 = lVar15;
                  this_00 = local_f8;
                } while (uVar19 != resX);
              }
              local_134 = local_134 + 1;
            } while (local_134 != resY);
          }
          local_100 = local_100 + 1;
        } while (local_100 != local_a8);
      }
      local_11c.startVtx = local_e4;
      local_11c.resY = (unsigned_short)resY;
      local_11c.resX = (unsigned_short)resX;
      __position._M_current =
           (this_00->grids).
           super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_11c.lineStride = resX;
      if (__position._M_current ==
          (this_00->grids).
          super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
        ::_M_realloc_insert<embree::SceneGraph::GridMeshNode::Grid>(local_b8,__position,&local_11c);
      }
      else {
        (__position._M_current)->resX = (unsigned_short)resX;
        (__position._M_current)->resY = (unsigned_short)resY;
        (__position._M_current)->startVtx = local_e4;
        (__position._M_current)->lineStride = resX;
        ppGVar2 = &(this_00->grids).
                   super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppGVar2 = *ppGVar2 + 1;
      }
      local_110 = local_110 + 1;
    } while (local_110 <
             (ulong)((long)(local_c0->quads).
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_c0->quads).
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  (local_d8->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_d8;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_grids ( Ref<SceneGraph::QuadMeshNode> qmesh , const unsigned int resX, const unsigned int resY )
  {
    const size_t timeSteps = qmesh->positions.size();
    Ref<SceneGraph::GridMeshNode> gmesh = new SceneGraph::GridMeshNode(qmesh->material,qmesh->time_range,timeSteps);
    std::vector<SceneGraph::QuadMeshNode::Quad>& quads = qmesh->quads;

    for (size_t i=0;i<quads.size();i++)
    {
      const unsigned int startVtx = (unsigned int) gmesh->positions[0].size();
      const unsigned int lineStride = resX;
      for (size_t t=0;t<timeSteps;t++)
      {
        const SceneGraph::GridMeshNode::Vertex v00 = qmesh->positions[t][quads[i].v0];
        const SceneGraph::GridMeshNode::Vertex v01 = qmesh->positions[t][quads[i].v1];
        const SceneGraph::GridMeshNode::Vertex v10 = qmesh->positions[t][quads[i].v3];
        const SceneGraph::GridMeshNode::Vertex v11 = qmesh->positions[t][quads[i].v2];
        for (unsigned int y=0; y<resY; y++)
        {
          for (unsigned int x=0; x<resX; x++)
          {
            const float u = (float)x / (resX-1);
            const float v = (float)y / (resY-1);
            const SceneGraph::GridMeshNode::Vertex vtx = v00 * (1.0f-u) * (1.0f-v) + v01 * u * (1.0f-v) + v10 * (1.0f-u) * v + v11 * u * v;
            gmesh->positions[t].push_back( vtx );
          }
        }
      }
      assert(startVtx + resX * resY == gmesh->positions[0].size());
      gmesh->grids.push_back(SceneGraph::GridMeshNode::Grid(startVtx,lineStride,resX,resY));
    }
    return gmesh.dynamicCast<SceneGraph::Node>();
  }